

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_parse_ext_op(lysc_ext_instance *ext,lyd_node *parent,ly_in *in,LYD_FORMAT format,
                       lyd_type data_type,lyd_node **tree,lyd_node **op)

{
  LY_ERR LVar1;
  ly_ctx *ctx;
  char *pcVar2;
  
  if (ext == (lysc_ext_instance *)0x0) {
    pcVar2 = "ext";
    ctx = (ly_ctx *)0x0;
  }
  else {
    ctx = ext->module->ctx;
    if (in == (ly_in *)0x0) {
      pcVar2 = "in";
    }
    else if (data_type == LYD_TYPE_DATA_YANG) {
      pcVar2 = "data_type";
    }
    else {
      if ((parent != (lyd_node *)0x0 || tree != (lyd_node **)0x0) || op != (lyd_node **)0x0) {
        LVar1 = lyd_parse_op_(ctx,ext,parent,in,format,data_type,tree,op);
        return LVar1;
      }
      pcVar2 = "parent || tree || op";
    }
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lyd_parse_ext_op");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_parse_ext_op(const struct lysc_ext_instance *ext, struct lyd_node *parent, struct ly_in *in, LYD_FORMAT format,
        enum lyd_type data_type, struct lyd_node **tree, struct lyd_node **op)
{
    const struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;

    LY_CHECK_ARG_RET(ctx, ext, in, data_type, parent || tree || op, LY_EINVAL);

    return lyd_parse_op_(ctx, ext, parent, in, format, data_type, tree, op);
}